

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int do_hex_dump(BIO *out,uchar *buf,int buflen)

{
  int iVar1;
  char local_3a;
  char local_39;
  uchar *puStack_38;
  char hextmp [2];
  uchar *q;
  uchar *p;
  int buflen_local;
  uchar *buf_local;
  BIO *out_local;
  
  if (out != (BIO *)0x0) {
    puStack_38 = buf + buflen;
    for (q = buf; q != puStack_38; q = q + 1) {
      local_3a = "0123456789ABCDEF"[(int)(uint)*q >> 4];
      local_39 = "0123456789ABCDEF"[(int)(*q & 0xf)];
      iVar1 = maybe_write(out,&local_3a,2);
      if (iVar1 == 0) {
        return -1;
      }
    }
  }
  return buflen << 1;
}

Assistant:

static int do_hex_dump(BIO *out, unsigned char *buf, int buflen) {
  static const char hexdig[] = "0123456789ABCDEF";
  unsigned char *p, *q;
  char hextmp[2];
  if (out) {
    p = buf;
    q = buf + buflen;
    while (p != q) {
      hextmp[0] = hexdig[*p >> 4];
      hextmp[1] = hexdig[*p & 0xf];
      if (!maybe_write(out, hextmp, 2)) {
        return -1;
      }
      p++;
    }
  }
  return buflen << 1;
}